

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

string * spvtools::utils::ToString<unsigned_long>(string *__return_storage_ptr__,unsigned_long val)

{
  stringstream local_1a0 [8];
  stringstream os;
  undefined1 auStack_190 [376];
  ulong local_18;
  unsigned_long val_local;
  
  local_18 = val;
  val_local = (unsigned_long)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(auStack_190,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T val) {
  static_assert(
      std::is_arithmetic<T>::value,
      "spvtools::utils::ToString is restricted to only arithmetic values");
  std::stringstream os;
  os << val;
  return os.str();
}